

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O3

void __thiscall Imf_2_5::Header::setVersion(Header *this,int version)

{
  ArgExc *this_00;
  Attribute local_20;
  undefined4 local_18;
  
  if (version == 1) {
    Attribute::Attribute(&local_20);
    local_20._vptr_Attribute = (_func_int **)&PTR__Attribute_003e0b00;
    local_18 = 1;
    insert(this,"version",&local_20);
    Attribute::~Attribute(&local_20);
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"We can only process version 1");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
Header::setVersion(const int version)
{
    if (version != 1)
    {
        throw IEX_NAMESPACE::ArgExc ("We can only process version 1");
    }

    insert ("version", IntAttribute (version));
}